

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_console.cpp
# Opt level: O0

void __thiscall FCommandBuffer::AddChar(FCommandBuffer *this,int character)

{
  uint uVar1;
  size_t sVar2;
  char local_15;
  int local_14;
  char foo;
  FCommandBuffer *pFStack_10;
  int character_local;
  FCommandBuffer *this_local;
  
  uVar1 = this->CursorPos;
  local_14 = character;
  pFStack_10 = this;
  sVar2 = FString::Len(&this->Text);
  if (uVar1 == sVar2) {
    FString::operator+=(&this->Text,(char)local_14);
  }
  else {
    local_15 = (char)local_14;
    FString::Insert(&this->Text,(ulong)this->CursorPos,&local_15,1);
  }
  this->CursorPos = this->CursorPos + 1;
  MakeStartPosGood(this);
  return;
}

Assistant:

void AddChar(int character)
	{
		///FIXME: Not Unicode-aware
		if (CursorPos == Text.Len())
		{
			Text += char(character);
		}
		else
		{
			char foo = char(character);
			Text.Insert(CursorPos, &foo, 1);
		}
		CursorPos++;
		MakeStartPosGood();
	}